

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

lws_http_mount * lws_find_mount(lws *wsi,char *uri_ptr,int uri_len)

{
  byte bVar1;
  byte bVar2;
  lws_http_mount *plVar3;
  byte bVar4;
  int iVar5;
  lws_http_mount *plVar6;
  lws_http_mount *plVar7;
  
  plVar7 = (lws_http_mount *)&(wsi->vhost->http).mount_list;
  plVar3 = (lws_http_mount *)0x0;
  bVar4 = 0;
  while (bVar2 = bVar4, plVar6 = plVar3, plVar7 = plVar7->mount_next,
        plVar7 != (lws_http_mount *)0x0) {
    bVar1 = plVar7->mountpoint_len;
    plVar3 = plVar6;
    bVar4 = bVar2;
    if (((((int)(uint)bVar1 <= uri_len) &&
         (iVar5 = strncmp(uri_ptr,plVar7->mountpoint,(ulong)bVar1), iVar5 == 0)) &&
        ((uri_ptr[bVar1] == '\0' || ((uri_ptr[bVar1] == '/' || (bVar1 == 1)))))) &&
       ((plVar7->origin_protocol == '\x03' ||
        ((plVar3 = plVar7, bVar4 = bVar1, plVar7->origin_protocol != '\x06' &&
         (((((iVar5 = lws_hdr_total_length(wsi,WSI_TOKEN_GET_URI), iVar5 != 0 ||
             (iVar5 = lws_hdr_total_length(wsi,WSI_TOKEN_POST_URI), iVar5 != 0)) ||
            (iVar5 = lws_hdr_total_length(wsi,WSI_TOKEN_HEAD_URI), iVar5 != 0)) ||
           (((wsi->field_0x2dc & 2) != 0 &&
            (iVar5 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_COLON_PATH), iVar5 != 0)))) ||
          (plVar3 = plVar6, bVar4 = bVar2, plVar7->protocol != (char *)0x0)))))))) {
      bVar1 = plVar7->mountpoint_len;
      if (bVar2 < bVar1) {
        plVar6 = plVar7;
      }
      plVar3 = plVar6;
      bVar4 = bVar2;
      if (bVar2 <= bVar1) {
        bVar4 = bVar1;
      }
    }
  }
  return plVar6;
}

Assistant:

const struct lws_http_mount *
lws_find_mount(struct lws *wsi, const char *uri_ptr, int uri_len)
{
	const struct lws_http_mount *hm, *hit = NULL;
	int best = 0;

	hm = wsi->vhost->http.mount_list;
	while (hm) {
		if (uri_len >= hm->mountpoint_len &&
		    !strncmp(uri_ptr, hm->mountpoint, hm->mountpoint_len) &&
		    (uri_ptr[hm->mountpoint_len] == '\0' ||
		     uri_ptr[hm->mountpoint_len] == '/' ||
		     hm->mountpoint_len == 1)
		    ) {
			if (hm->origin_protocol == LWSMPRO_CALLBACK ||
			    ((hm->origin_protocol == LWSMPRO_CGI ||
			     lws_hdr_total_length(wsi, WSI_TOKEN_GET_URI) ||
			     lws_hdr_total_length(wsi, WSI_TOKEN_POST_URI) ||
			     lws_hdr_total_length(wsi, WSI_TOKEN_HEAD_URI) ||
			     (wsi->mux_substream &&
				lws_hdr_total_length(wsi,
						WSI_TOKEN_HTTP_COLON_PATH)) ||
			     hm->protocol) &&
			    hm->mountpoint_len > best)) {
				best = hm->mountpoint_len;
				hit = hm;
			}
		}
		hm = hm->mount_next;
	}

	return hit;
}